

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O3

int error_finalizer(lua_State *L)

{
  char *pcVar1;
  char *__s;
  
  pcVar1 = lua_tolstring(L,-1,(size_t *)0x0);
  fputs("ERROR in finalizer: ",_stderr);
  __s = "?";
  if (pcVar1 != (char *)0x0) {
    __s = pcVar1;
  }
  fputs(__s,_stderr);
  fputc(10,_stderr);
  fflush(_stderr);
  return 0;
}

Assistant:

static int error_finalizer(lua_State *L)
{
  const char *s = lua_tostring(L, -1);
  fputs("ERROR in finalizer: ", stderr);
  fputs(s ? s : "?", stderr);
  fputc('\n', stderr);
  fflush(stderr);
  return 0;
}